

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O2

void nn_ws_handshake_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_fsm **__s;
  int *piVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  void *pvVar6;
  size_t sVar7;
  ulong uVar8;
  size_t hashed_len;
  long lVar9;
  char *pcVar10;
  nn_fsm_fn p_Var11;
  nn_usock *self_00;
  ulong uVar12;
  nn_fsm *pnVar13;
  nn_fsm *pnVar14;
  nn_queue_item *pnVar15;
  undefined1 *puVar16;
  long lVar17;
  nn_fsm_fn len;
  undefined8 uVar18;
  nn_fsm **local_e8;
  nn_fsm **local_c8 [4];
  nn_fsm *local_a8;
  nn_fsm *local_a0;
  nn_fsm *local_98;
  nn_fsm *local_90;
  nn_fsm *local_88;
  nn_fsm *local_80;
  nn_fsm *local_78;
  nn_fsm *local_70;
  nn_fsm *local_68;
  nn_fsm *local_60;
  uint8_t rand_key [16];
  nn_iovec open_request;
  
  uVar12 = (ulong)(uint)src;
  uVar8 = (ulong)*(uint *)&self[1].fn;
  iVar3 = 0x130ed8;
  switch(*(uint *)&self[1].fn) {
  case 1:
    if (src == -2) {
      if (type == -2) {
        if (self[0x33].fn == (nn_fsm_fn)0x0) {
          if (self[0x33].shutdown_fn < (nn_fsm_fn)0x4) {
            pcVar10 = "handshaker->recv_len >= NN_WS_HANDSHAKE_TERMSEQ_LEN";
            uVar18 = 0x19a;
          }
          else {
            nn_timer_start((nn_timer *)&self[1].shutdown_fn,*(int *)&self[3].stopped.srcptr);
            iVar3 = *(int *)((long)&self[1].fn + 4);
            if (iVar3 == 2) {
              len = self[0x33].shutdown_fn;
              if (len < (nn_fsm_fn)0x1001) {
                *(undefined4 *)&self[1].fn = 2;
                self_00 = *(nn_usock **)&self[3].stopped.type;
                local_e8 = &self[4].owner;
                goto LAB_0012b397;
              }
              pcVar10 = "handshaker->recv_len <= sizeof (handshaker->opening_hs)";
              uVar18 = 0x1a9;
            }
            else if (iVar3 == 1) {
              if (self[0x33].shutdown_fn < (nn_fsm_fn)0x201) {
                *(undefined4 *)&self[1].fn = 4;
                nn_random_generate(rand_key,0x10);
                hashed_len = 0x19;
                nn_base64_encode(rand_key,0x10,(char *)local_c8,0x19);
                sVar7 = strlen((char *)local_c8);
                if (sVar7 == 0x18) {
                  iVar3 = nn_ws_handshake_hash_key
                                    ((char *)local_c8,0x18,(char *)&self[0x34].stopped.type,
                                     hashed_len);
                  if (iVar3 == 0x1c) {
                    lVar17 = -8;
                    while (lVar9 = lVar17, lVar9 + 0x10 != 0xa8) {
                      lVar17 = lVar9 + 0x10;
                      if (*(int *)((long)&NN_WS_HANDSHAKE_SP_MAP[0].ws_sp + lVar9 + 4) ==
                          *(int *)(*(long *)(*(long *)(self[4].shutdown_fn + 0x68) + 0x68) + 4)) {
                        __s = &self[4].owner;
                        uVar18._0_4_ = self[4].state;
                        uVar18._4_4_ = self[4].src;
                        sprintf((char *)__s,
                                "GET %s HTTP/1.1\r\nHost: %s\r\nUpgrade: websocket\r\nConnection: Upgrade\r\nSec-WebSocket-Key: %s\r\nSec-WebSocket-Version: 13\r\nSec-WebSocket-Protocol: %s\r\n\r\n"
                                ,uVar18,self[4].srcptr,local_c8,
                                *(undefined8 *)((long)&NN_WS_HANDSHAKE_SP_MAP[1].server + lVar9));
                        open_request.iov_len = strlen((char *)__s);
                        open_request.iov_base = __s;
                        nn_usock_send(*(nn_usock **)&self[3].stopped.type,&open_request,1);
                        return;
                      }
                    }
                    pcVar10 = "i < NN_WS_HANDSHAKE_SP_MAP_LEN";
                    uVar18 = 0x4d7;
                  }
                  else {
                    pcVar10 = "rc == NN_WS_HANDSHAKE_ACCEPT_KEY_LEN";
                    uVar18 = 0x4cc;
                  }
                }
                else {
                  pcVar10 = "encoded_key_len == sizeof (encoded_key) - 1";
                  uVar18 = 0x4c5;
                }
              }
              else {
                pcVar10 = "handshaker->recv_len <= sizeof (handshaker->response)";
                uVar18 = 0x1a2;
              }
            }
            else {
              pcVar10 = "0";
              uVar18 = 0x1b0;
            }
          }
        }
        else {
          pcVar10 = "handshaker->recv_pos == 0";
          uVar18 = 0x199;
        }
LAB_0012b6c8:
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar10,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                ,uVar18);
        goto LAB_0012b6cf;
      }
      pcVar10 = "Unexpected action";
      uVar8 = 1;
      uVar12 = 0xfffffffffffffffe;
      uVar18 = 0x1b5;
    }
    else {
      pcVar10 = "Unexpected source";
      uVar8 = 1;
      uVar18 = 0x1b9;
    }
    break;
  case 2:
    if (src == 2) {
      if (type == 1) {
LAB_0012b349:
        nn_timer_stop((nn_timer *)&self[1].shutdown_fn);
        *(undefined4 *)&self[1].fn = 7;
        return;
      }
      pcVar10 = "Unexpected action";
      uVar8 = 2;
      uVar12 = 2;
      uVar18 = 0x21e;
    }
    else if (src == 1) {
      if (type == 8) {
        return;
      }
      if (type == 5) goto LAB_0012b349;
      if (type == 4) {
        local_e8 = &self[4].owner;
        pvVar6 = memchr(local_e8,0,0x1000);
        if (pvVar6 == (void *)0x0) {
          pcVar10 = "memchr (self->opening_hs, \'\\0\', sizeof (self->opening_hs))";
          uVar18 = 0x35b;
        }
        else {
          sVar7 = strlen((char *)local_e8);
          if (sVar7 < 0x1000) {
            local_c8[0] = local_e8;
            pcVar10 = strstr((char *)local_e8,"\r\n\r\n");
            if (pcVar10 != (char *)0x0) {
              self[0x34].srcptr = (void *)0x0;
              self[0x34].owner = (nn_fsm *)0x0;
              self[0x34].shutdown_fn = (nn_fsm_fn)0x0;
              self[0x34].state = 0;
              self[0x34].src = 0;
              self[0x33].stopped.item.next = (nn_queue_item *)0x0;
              self[0x34].fn = (nn_fsm_fn)0x0;
              self[0x33].stopped.srcptr = (void *)0x0;
              *(undefined8 *)&self[0x33].stopped.type = 0;
              self[0x33].stopped.fsm = (nn_fsm *)0x0;
              *(undefined8 *)&self[0x33].stopped.src = 0;
              self[0x33].owner = (nn_fsm *)0x0;
              self[0x33].ctx = (nn_ctx *)0x0;
              self[0x33].state = 0;
              self[0x33].src = 0;
              self[0x33].srcptr = (void *)0x0;
              self[0x35].stopped.fsm = (nn_fsm *)0x0;
              *(undefined8 *)&self[0x35].stopped.src = 0;
              *(undefined4 *)&self[0x35].stopped.item.next = 0xffffffff;
              iVar3 = nn_ws_match_token("GET ",(char **)local_c8,0,iVar3);
              if (iVar3 != 0) {
                uVar18 = 0;
                iVar3 = nn_ws_match_value(" ",(char **)local_c8,0,0,(char **)&self[0x35].stopped,
                                          (size_t *)&self[0x35].stopped.src);
                if (((iVar3 != 0) &&
                    (iVar3 = nn_ws_match_token("HTTP/1.1",(char **)local_c8,0,(int)uVar18),
                    iVar3 != 0)) &&
                   (iVar3 = nn_ws_match_token("\r\n",(char **)local_c8,0,(int)uVar18), iVar3 != 0))
                {
                  local_78 = (nn_fsm *)&self[0x33].stopped;
                  local_88 = (nn_fsm *)&self[0x33].stopped.srcptr;
                  pnVar15 = &self[0x33].stopped.item;
                  local_90 = (nn_fsm *)&self[0x34].shutdown_fn;
                  local_a0 = (nn_fsm *)&self[0x34].srcptr;
                  local_60 = (nn_fsm *)&self[0x33].ctx;
                  local_80 = (nn_fsm *)&self[0x33].stopped.src;
                  piVar1 = &self[0x33].stopped.type;
                  local_98 = (nn_fsm *)&self[0x34].state;
                  local_a8 = (nn_fsm *)&self[0x34].owner;
                  local_68 = (nn_fsm *)&self[0x35].stopped.srcptr;
                  local_70 = (nn_fsm *)&self[0x35].stopped.type;
                  do {
                    iVar3 = (int)uVar18;
                    if (*(char *)local_c8[0] == '\0') {
LAB_0012b82f:
                      uVar5 = 3;
                      lVar17._0_4_ = self[0x33].state;
                      lVar17._4_4_ = self[0x33].src;
                      if ((((lVar17 == 0) ||
                           (pnVar13 = (nn_fsm *)local_88->fn, pnVar13 == (nn_fsm *)0x0)) ||
                          (pnVar15 = pnVar15->next, pnVar15 == (nn_queue_item *)0x0)) ||
                         (((nn_fsm *)local_78->fn == (nn_fsm *)0x0 ||
                          ((nn_fsm *)local_90->fn == (nn_fsm *)0x0)))) goto LAB_0012b948;
                      iVar4 = nn_ws_validate_value
                                        ("13",(char *)local_90->fn,(size_t)local_98->fn,iVar3);
                      if (iVar4 == 0) {
                        uVar5 = 4;
                        goto LAB_0012b948;
                      }
                      iVar4 = nn_ws_validate_value
                                        ("websocket",(char *)pnVar13,*(size_t *)piVar1,iVar3);
                      if ((iVar4 == 0) ||
                         (iVar3 = nn_ws_validate_value
                                            ("Upgrade",(char *)pnVar15,(size_t)self[0x34].fn,iVar3),
                         iVar3 == 0)) goto LAB_0012b948;
                      pnVar13 = (nn_fsm *)local_a0->fn;
                      if (pnVar13 != (nn_fsm *)0x0) {
                        pnVar14 = (nn_fsm *)local_a8->fn;
                        uVar5 = 7;
                        lVar17 = -0x10;
                        goto LAB_0012b8f7;
                      }
                      iVar3 = nn_pipebase_ispeer((nn_pipebase *)self[4].shutdown_fn,0x10);
                      uVar5 = 6;
                      if (iVar3 != 0) {
                        uVar5 = 0;
                      }
                      *(undefined4 *)&self[0x35].stopped.item.next = uVar5;
                      goto LAB_0012b3d9;
                    }
                    iVar4 = nn_ws_match_token("Host:",(char **)local_c8,1,iVar3);
                    pnVar13 = (nn_fsm *)&self[0x33].state;
                    pnVar14 = (nn_fsm *)&self[0x33].srcptr;
                    if (((((iVar4 == 0) &&
                          (iVar4 = nn_ws_match_token("Origin:",(char **)local_c8,1,iVar3),
                          pnVar13 = (nn_fsm *)&self[0x33].owner, pnVar14 = local_60, iVar4 == 0)) &&
                         (iVar4 = nn_ws_match_token("Sec-WebSocket-Key:",(char **)local_c8,1,iVar3),
                         pnVar13 = local_78, pnVar14 = local_80, iVar4 == 0)) &&
                        ((iVar4 = nn_ws_match_token("Upgrade:",(char **)local_c8,1,iVar3),
                         pnVar13 = local_88, pnVar14 = (nn_fsm *)piVar1, iVar4 == 0 &&
                         (iVar4 = nn_ws_match_token("Connection:",(char **)local_c8,1,iVar3),
                         pnVar13 = (nn_fsm *)pnVar15, pnVar14 = self + 0x34, iVar4 == 0)))) &&
                       ((iVar4 = nn_ws_match_token("Sec-WebSocket-Version:",(char **)local_c8,1,
                                                   iVar3), pnVar13 = local_90, pnVar14 = local_98,
                        iVar4 == 0 &&
                        ((iVar4 = nn_ws_match_token("Sec-WebSocket-Protocol:",(char **)local_c8,1,
                                                    iVar3), pnVar13 = local_a0, pnVar14 = local_a8,
                         iVar4 == 0 &&
                         (iVar4 = nn_ws_match_token("Sec-WebSocket-Extensions:",(char **)local_c8,1,
                                                    iVar3), pnVar13 = local_68, pnVar14 = local_70,
                         iVar4 == 0)))))) {
                      iVar4 = nn_ws_match_token("\r\n",(char **)local_c8,1,iVar3);
                      if (iVar4 != 0) {
                        if (*(char *)local_c8[0] == '\0') goto LAB_0012b82f;
                        pcVar10 = "strlen (pos) == 0";
                        uVar18 = 0x3cb;
                        goto LAB_0012b6c8;
                      }
                      pnVar13 = (nn_fsm *)0x0;
                      pnVar14 = (nn_fsm *)0x0;
                    }
                    uVar18 = 1;
                    iVar3 = nn_ws_match_value("\r\n",(char **)local_c8,1,1,(char **)pnVar13,
                                              (size_t *)pnVar14);
                  } while (iVar3 != 0);
                }
              }
            }
            p_Var11 = self[0x33].shutdown_fn + (long)self[0x33].fn;
            self[0x33].fn = p_Var11;
            if (p_Var11 < (nn_fsm_fn)0x1000) {
              if ((nn_fsm_fn)0x3 < p_Var11) {
                local_e8 = (nn_fsm **)((long)local_e8 + (long)p_Var11);
                puVar16 = (undefined1 *)((long)&self[4].srcptr + 4);
                for (lVar17 = 0; lVar17 != -4; lVar17 = lVar17 + -1) {
                  iVar3 = bcmp("\r\n\r\n",puVar16 + (long)p_Var11,lVar17 + 4U);
                  if (iVar3 == 0) {
                    if (3 < lVar17 + 4U) {
                      pcVar10 = "i < NN_WS_HANDSHAKE_TERMSEQ_LEN";
                      uVar18 = 0x1f1;
                      goto LAB_0012b6c8;
                    }
                    break;
                  }
                  puVar16 = puVar16 + 1;
                }
                len = (nn_fsm_fn)-lVar17;
                self[0x33].shutdown_fn = len;
                if (0x1000 < (ulong)((long)p_Var11 - lVar17)) {
                  *(undefined4 *)&self[0x35].stopped.item.next = 1;
                  goto LAB_0012b3d9;
                }
LAB_0012b41d:
                pnVar15 = &self[0x32].stopped.item;
                *(int *)&pnVar15->next = *(int *)&pnVar15->next + 1;
                self_00 = *(nn_usock **)&self[3].stopped.type;
LAB_0012b397:
                nn_usock_recv(self_00,local_e8,(size_t)len,(int *)0x0);
                return;
              }
              pcVar10 = "handshaker->recv_pos >= (int) NN_WS_HANDSHAKE_TERMSEQ_LEN";
              uVar18 = 0x1e3;
            }
            else {
              pcVar10 = "handshaker->recv_pos < sizeof (handshaker->opening_hs)";
              uVar18 = 0x1db;
            }
          }
          else {
            pcVar10 = "strlen (self->opening_hs) < sizeof (self->opening_hs)";
            uVar18 = 0x35f;
          }
        }
        goto LAB_0012b6c8;
      }
      pcVar10 = "Unexpected action";
      uVar8 = 2;
      uVar12 = 1;
      uVar18 = 0x214;
    }
    else {
      pcVar10 = "Unexpected source";
      uVar8 = 2;
      uVar18 = 0x222;
    }
    break;
  case 3:
    if (src == 2) {
      if (type == 1) goto LAB_0012b349;
      pcVar10 = "Unexpected action";
      uVar8 = 3;
      uVar12 = 2;
      uVar18 = 0x244;
    }
    else if (src == 1) {
      if (type == 8) {
        return;
      }
      if (type == 5) goto LAB_0012b349;
      if (type == 3) {
LAB_0012b209:
        nn_timer_stop((nn_timer *)&self[1].shutdown_fn);
        *(undefined4 *)&self[1].fn = 8;
        return;
      }
      pcVar10 = "Unexpected action";
      uVar8 = 3;
      uVar12 = 1;
      uVar18 = 0x23a;
    }
    else {
      pcVar10 = "Unexpected source";
      uVar8 = 3;
      uVar18 = 0x248;
    }
    break;
  case 4:
    if (src == 2) {
      if (type == 1) goto LAB_0012b349;
      pcVar10 = "Unexpected action";
      uVar8 = 4;
      uVar12 = 2;
      uVar18 = 0x26a;
    }
    else if (src == 1) {
      if (type == 8) {
        return;
      }
      if (type == 5) goto LAB_0012b349;
      if (type == 3) {
        *(undefined4 *)&self[1].fn = 5;
        self_00 = *(nn_usock **)&self[3].stopped.type;
        len = self[0x33].shutdown_fn;
        local_e8 = (nn_fsm **)((long)&self[0x35].stopped.item.next + 4);
        goto LAB_0012b397;
      }
      pcVar10 = "Unexpected action";
      uVar8 = 4;
      uVar12 = 1;
      uVar18 = 0x260;
    }
    else {
      pcVar10 = "Unexpected source";
      uVar8 = 4;
      uVar18 = 0x26e;
    }
    break;
  case 5:
    if (src == 2) {
      if (type == 1) goto LAB_0012b349;
      pcVar10 = "Unexpected action";
      uVar8 = 5;
      uVar12 = 2;
      uVar18 = 0x2cf;
    }
    else if (src == 1) {
      if (type == 8) {
        return;
      }
      if (type == 5) goto LAB_0012b349;
      if (type == 4) {
        local_e8 = (nn_fsm **)((long)&self[0x35].stopped.item.next + 4);
        pvVar6 = memchr(local_e8,0,0x200);
        if (pvVar6 == (void *)0x0) {
          pcVar10 = "memchr (self->response, \'\\0\', sizeof (self->response))";
          uVar18 = 0x426;
        }
        else {
          sVar7 = strlen((char *)local_e8);
          if (sVar7 < 0x200) {
            local_c8[0] = local_e8;
            pcVar10 = strstr((char *)local_e8,"\r\n\r\n");
            if (pcVar10 != (char *)0x0) {
              *(undefined8 *)&self[0x34].stopped.src = 0;
              self[0x34].stopped.srcptr = (void *)0x0;
              self[0x34].ctx = (nn_ctx *)0x0;
              self[0x34].stopped.fsm = (nn_fsm *)0x0;
              self[0x34].srcptr = (void *)0x0;
              self[0x34].owner = (nn_fsm *)0x0;
              self[0x34].shutdown_fn = (nn_fsm_fn)0x0;
              self[0x34].state = 0;
              self[0x34].src = 0;
              self[0x33].stopped.item.next = (nn_queue_item *)0x0;
              self[0x34].fn = (nn_fsm_fn)0x0;
              self[0x33].stopped.srcptr = (void *)0x0;
              *(undefined8 *)&self[0x33].stopped.type = 0;
              self[0x35].state = 0;
              self[0x35].src = 0;
              self[0x35].srcptr = (void *)0x0;
              self[0x35].owner = (nn_fsm *)0x0;
              self[0x35].ctx = (nn_ctx *)0x0;
              iVar3 = nn_ws_match_token("HTTP/1.1 ",(char **)local_c8,0,iVar3);
              if (iVar3 != 0) {
                local_78 = (nn_fsm *)&self[0x35].state;
                local_88 = (nn_fsm *)&self[0x35].srcptr;
                iVar3 = nn_ws_match_value(" ",(char **)local_c8,0,0,(char **)local_78,
                                          (size_t *)local_88);
                if (iVar3 != 0) {
                  uVar18 = 0;
                  iVar3 = nn_ws_match_value("\r\n",(char **)local_c8,0,0,(char **)&self[0x35].owner,
                                            (size_t *)&self[0x35].ctx);
                  if (iVar3 != 0) {
                    piVar1 = &self[0x34].stopped.src;
                    local_80 = (nn_fsm *)&self[0x33].stopped.srcptr;
                    pnVar15 = &self[0x33].stopped.item;
                    local_90 = (nn_fsm *)&self[0x34].shutdown_fn;
                    local_a0 = (nn_fsm *)&self[0x34].srcptr;
                    local_60 = (nn_fsm *)&self[0x34].stopped.srcptr;
                    piVar2 = &self[0x33].stopped.type;
                    local_98 = (nn_fsm *)&self[0x34].state;
                    local_a8 = (nn_fsm *)&self[0x34].owner;
                    local_68 = (nn_fsm *)&self[0x35].stopped.srcptr;
                    local_70 = (nn_fsm *)&self[0x35].stopped.type;
                    do {
                      iVar3 = (int)uVar18;
                      if (*(char *)local_c8[0] == '\0') {
LAB_0012b711:
                        if (((((nn_fsm *)local_78->fn == (nn_fsm *)0x0) ||
                             (pnVar13 = (nn_fsm *)local_80->fn, pnVar13 == (nn_fsm *)0x0)) ||
                            ((pnVar15 = pnVar15->next, pnVar15 == (nn_queue_item *)0x0 ||
                             (((pcVar10 = *(char **)piVar1, pcVar10 == (char *)0x0 ||
                               (iVar4 = nn_ws_validate_value
                                                  ("101",(char *)local_78->fn,(size_t)local_88->fn,
                                                   iVar3), iVar4 == 0)) ||
                              (iVar4 = nn_ws_validate_value
                                                 ("websocket",(char *)pnVar13,*(size_t *)piVar2,
                                                  iVar3), iVar4 == 0)))))) ||
                           ((iVar4 = nn_ws_validate_value
                                               ("Upgrade",(char *)pnVar15,(size_t)self[0x34].fn,
                                                iVar3), iVar4 == 0 ||
                            (iVar3 = nn_ws_validate_value
                                               ((char *)&self[0x34].stopped.type,pcVar10,
                                                (size_t)self[0x34].stopped.srcptr,iVar3), iVar3 == 0
                            )))) goto LAB_0012b349;
                        goto LAB_0012b209;
                      }
                      iVar4 = nn_ws_match_token("Server:",(char **)local_c8,1,iVar3);
                      pnVar13 = (nn_fsm *)&self[0x34].ctx;
                      pnVar14 = (nn_fsm *)&self[0x34].stopped;
                      if (((((iVar4 == 0) &&
                            (iVar4 = nn_ws_match_token("Sec-WebSocket-Accept:",(char **)local_c8,1,
                                                       iVar3), pnVar13 = (nn_fsm *)piVar1,
                            pnVar14 = local_60, iVar4 == 0)) &&
                           (iVar4 = nn_ws_match_token("Upgrade:",(char **)local_c8,1,iVar3),
                           pnVar13 = local_80, pnVar14 = (nn_fsm *)piVar2, iVar4 == 0)) &&
                          ((iVar4 = nn_ws_match_token("Connection:",(char **)local_c8,1,iVar3),
                           pnVar13 = (nn_fsm *)pnVar15, pnVar14 = self + 0x34, iVar4 == 0 &&
                           (iVar4 = nn_ws_match_token("Sec-WebSocket-Version-Server:",
                                                      (char **)local_c8,1,iVar3), pnVar13 = local_90
                           , pnVar14 = local_98, iVar4 == 0)))) &&
                         ((iVar4 = nn_ws_match_token("Sec-WebSocket-Protocol-Server:",
                                                     (char **)local_c8,1,iVar3), pnVar13 = local_a0,
                          pnVar14 = local_a8, iVar4 == 0 &&
                          (iVar4 = nn_ws_match_token("Sec-WebSocket-Extensions:",(char **)local_c8,1
                                                     ,iVar3), pnVar13 = local_68, pnVar14 = local_70
                          , iVar4 == 0)))) {
                        iVar4 = nn_ws_match_token("\r\n",(char **)local_c8,1,iVar3);
                        if (iVar4 != 0) {
                          if (*(char *)local_c8[0] == '\0') goto LAB_0012b711;
                          pcVar10 = "strlen (pos) == 0";
                          uVar18 = 0x48b;
                          goto LAB_0012b6c8;
                        }
                        pnVar13 = (nn_fsm *)0x0;
                        pnVar14 = (nn_fsm *)0x0;
                      }
                      uVar18 = 1;
                      iVar3 = nn_ws_match_value("\r\n",(char **)local_c8,1,1,(char **)pnVar13,
                                                (size_t *)pnVar14);
                    } while (iVar3 != 0);
                  }
                }
              }
            }
            p_Var11 = self[0x33].shutdown_fn + (long)self[0x33].fn;
            self[0x33].fn = p_Var11;
            if (p_Var11 < (nn_fsm_fn)0x200) {
              if ((nn_fsm_fn)0x3 < p_Var11) {
                local_e8 = (nn_fsm **)((long)local_e8 + (long)p_Var11);
                pnVar15 = &self[0x35].stopped.item;
                for (lVar17 = 0; lVar17 != -4; lVar17 = lVar17 + -1) {
                  iVar3 = bcmp("\r\n\r\n",p_Var11 + (long)&pnVar15->next,lVar17 + 4U);
                  if (iVar3 == 0) {
                    if (3 < lVar17 + 4U) {
                      pcVar10 = "i < NN_WS_HANDSHAKE_TERMSEQ_LEN";
                      uVar18 = 0x2a4;
                      goto LAB_0012b6c8;
                    }
                    break;
                  }
                  pnVar15 = (nn_queue_item *)((long)&pnVar15->next + 1);
                }
                len = (nn_fsm_fn)-lVar17;
                self[0x33].shutdown_fn = len;
                if (0x200 < (ulong)((long)p_Var11 - lVar17)) goto LAB_0012b349;
                goto LAB_0012b41d;
              }
              pcVar10 = "handshaker->recv_pos >= (int) NN_WS_HANDSHAKE_TERMSEQ_LEN";
              uVar18 = 0x299;
            }
            else {
              pcVar10 = "handshaker->recv_pos < sizeof (handshaker->response)";
              uVar18 = 0x291;
            }
          }
          else {
            pcVar10 = "strlen (self->response) < sizeof (self->response)";
            uVar18 = 0x42a;
          }
        }
        goto LAB_0012b6c8;
      }
      pcVar10 = "Unexpected action";
      uVar8 = 5;
      uVar12 = 1;
      uVar18 = 0x2c5;
    }
    else {
      pcVar10 = "Unexpected source";
      uVar8 = 5;
      uVar18 = 0x2d3;
    }
    break;
  case 6:
    if (src == 2) {
      if (type == 1) goto LAB_0012b349;
      pcVar10 = "Unexpected action";
      uVar8 = 6;
      uVar12 = 2;
      uVar18 = 0x2f6;
    }
    else if (src == 1) {
      if (type == 8) {
        return;
      }
      if (type == 5) goto LAB_0012b349;
      if (type == 3) goto LAB_0012b209;
      pcVar10 = "Unexpected action";
      uVar8 = 6;
      uVar12 = 1;
      uVar18 = 0x2ec;
    }
    else {
      pcVar10 = "Unexpected source";
      uVar8 = 6;
      uVar18 = 0x2fa;
    }
    break;
  case 7:
    if (src == 1) {
      return;
    }
    if (src == 2) {
      if (type == 2) {
        iVar3 = 2;
LAB_0012b23e:
        nn_ws_handshake_leave((nn_ws_handshake *)self,iVar3);
        return;
      }
      pcVar10 = "Unexpected action";
      uVar8 = 7;
      uVar12 = 2;
      uVar18 = 0x30f;
    }
    else {
      pcVar10 = "Unexpected source";
      uVar8 = 7;
      uVar18 = 0x313;
    }
    break;
  case 8:
    if (src == 1) {
      return;
    }
    if (src == 2) {
      if (type == 2) {
        iVar3 = 1;
        goto LAB_0012b23e;
      }
      pcVar10 = "Unexpected action";
      uVar8 = 8;
      uVar12 = 2;
      uVar18 = 0x328;
    }
    else {
      pcVar10 = "Unexpected source";
      uVar8 = 8;
      uVar18 = 0x32c;
    }
    break;
  case 9:
    pcVar10 = "Unexpected source";
    uVar8 = 9;
    uVar18 = 0x335;
    break;
  default:
    pcVar10 = "Unexpected state";
    uVar18 = 0x33b;
  }
  fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n",pcVar10,uVar8,uVar12,
          (ulong)(uint)type,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
          ,uVar18);
LAB_0012b6cf:
  fflush(_stderr);
  nn_err_abort();
LAB_0012b948:
  *(undefined4 *)&self[0x35].stopped.item.next = uVar5;
  goto LAB_0012b3d9;
  while (iVar3 = nn_ws_validate_value
                           (*(char **)((long)&NN_WS_HANDSHAKE_SP_MAP[1].ws_sp + lVar9),
                            (char *)pnVar13,(size_t)pnVar14,(int)lVar9), lVar17 = lVar9 + 0x10,
        iVar3 == 0) {
LAB_0012b8f7:
    lVar9 = lVar17;
    if (lVar9 + 0x10 == 0xa0) goto LAB_0012b948;
  }
  uVar5 = 6;
  if (*(int *)(*(long *)(*(long *)(self[4].shutdown_fn + 0x68) + 0x68) + 4) ==
      *(int *)((long)&NN_WS_HANDSHAKE_SP_MAP[1].server + lVar9)) {
    uVar5 = 0;
  }
  *(undefined4 *)&self[0x35].stopped.item.next = uVar5;
LAB_0012b3d9:
  *(undefined4 *)&self[1].fn = 3;
  nn_ws_handshake_server_reply((nn_ws_handshake *)self);
  return;
}

Assistant:

static void nn_ws_handshake_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_ws_handshake *handshaker;

    size_t i;

    handshaker = nn_cont (self, struct nn_ws_handshake, fsm);

    switch (handshaker->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_assert (handshaker->recv_pos == 0);
                nn_assert (handshaker->recv_len >= NN_WS_HANDSHAKE_TERMSEQ_LEN);

                nn_timer_start (&handshaker->timer, handshaker->timeout);

                switch (handshaker->mode) {
                case NN_WS_CLIENT:
                    /*  Send opening handshake to server. */
                    nn_assert (handshaker->recv_len <=
                        sizeof (handshaker->response));
                    handshaker->state = NN_WS_HANDSHAKE_STATE_CLIENT_SEND;
                    nn_ws_handshake_client_request (handshaker);
                    return;
                case NN_WS_SERVER:
                    /*  Begin receiving opening handshake from client. */
                    nn_assert (handshaker->recv_len <=
                        sizeof (handshaker->opening_hs));
                    handshaker->state = NN_WS_HANDSHAKE_STATE_SERVER_RECV;
                    nn_usock_recv (handshaker->usock, handshaker->opening_hs,
                        handshaker->recv_len, NULL);
                    return;
                default:
                    /*  Unexpected mode. */
                    nn_assert (0);
                    return;
                }

            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  SERVER_RECV state.                                                        */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_SERVER_RECV:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_RECEIVED:
                /*  Parse bytes received thus far. */
                switch (nn_ws_handshake_parse_client_opening (handshaker)) {
                case NN_WS_HANDSHAKE_INVALID:
                    /*  Opening handshake parsed successfully but does not
                        contain valid values. Respond failure to client. */
                    handshaker->state = NN_WS_HANDSHAKE_STATE_SERVER_REPLY;
                    nn_ws_handshake_server_reply (handshaker);
                    return;
                case NN_WS_HANDSHAKE_VALID:
                    /*  Opening handshake parsed successfully, and is valid.
                        Respond success to client. */
                    handshaker->state = NN_WS_HANDSHAKE_STATE_SERVER_REPLY;
                    nn_ws_handshake_server_reply (handshaker);
                    return;
                case NN_WS_HANDSHAKE_RECV_MORE:
                    /*  Not enough bytes have been received to determine
                        validity; remain in the receive state, and retrieve
                        more bytes from client. */
                    handshaker->recv_pos += handshaker->recv_len;

                    /*  Validate the previous recv operation. */
                    nn_assert (handshaker->recv_pos <
                        sizeof (handshaker->opening_hs));

                    /*  Ensure we can back-track at least the length of the
                        termination sequence to determine how many bytes to
                        receive on the next retry. This is an assertion, not
                        a conditional, since under no condition is it
                        necessary to initially receive so few bytes. */
                    nn_assert (handshaker->recv_pos >=
                        (int) NN_WS_HANDSHAKE_TERMSEQ_LEN);

                    /*  We only compare if we have at least one byte to
                        compare against.  When i drops to zero, it means
                        we don't have any bytes to match against, and it is
                        automatically true. */
                    for (i = NN_WS_HANDSHAKE_TERMSEQ_LEN; i > 0; i--) {
                        if (memcmp (NN_WS_HANDSHAKE_TERMSEQ,
                            handshaker->opening_hs + handshaker->recv_pos - i,
                            i) == 0) {
                            break;
                        }
                    }

                    nn_assert (i < NN_WS_HANDSHAKE_TERMSEQ_LEN);

                    handshaker->recv_len = NN_WS_HANDSHAKE_TERMSEQ_LEN - i;

                    /*  In the unlikely case the client would overflow what we
                        assumed was a sufficiently-large buffer to receive the
                        handshake, we fail the client. */
                    if (handshaker->recv_len + handshaker->recv_pos >
                        sizeof (handshaker->opening_hs)) {
                        handshaker->response_code =
                            NN_WS_HANDSHAKE_RESPONSE_TOO_BIG;
                        handshaker->state =
                            NN_WS_HANDSHAKE_STATE_SERVER_REPLY;
                        nn_ws_handshake_server_reply (handshaker);
                    }
                    else {
                        handshaker->retries++;
                        nn_usock_recv (handshaker->usock,
                            handshaker->opening_hs + handshaker->recv_pos,
                            handshaker->recv_len, NULL);
                    }
                    return;
                default:
                    nn_fsm_error ("Unexpected handshake result",
                        handshaker->state, src, type);
                }
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  SERVER_REPLY state.                                                       */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_SERVER_REPLY:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:
                /*  As per RFC 6455 4.2.2, the handshake is now complete
                    and the connection is immediately ready for send/recv. */
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_DONE;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  CLIENT_SEND state.                                                        */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_CLIENT_SEND:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:
                handshaker->state = NN_WS_HANDSHAKE_STATE_CLIENT_RECV;
                nn_usock_recv (handshaker->usock, handshaker->response,
                    handshaker->recv_len, NULL);
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  CLIENT_RECV state.                                                        */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_CLIENT_RECV:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_RECEIVED:
                /*  Parse bytes received thus far. */
                switch (nn_ws_handshake_parse_server_response (handshaker)) {
                case NN_WS_HANDSHAKE_INVALID:
                    /*  Opening handshake parsed successfully but does not
                        contain valid values. Fail connection. */
                        nn_timer_stop (&handshaker->timer);
                        handshaker->state =
                            NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                    return;
                case NN_WS_HANDSHAKE_VALID:
                    /*  As per RFC 6455 4.2.2, the handshake is now complete
                        and the connection is immediately ready for send/recv. */
                    nn_timer_stop (&handshaker->timer);
                    handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_DONE;
                    return;
                case NN_WS_HANDSHAKE_RECV_MORE:
                    /*  Not enough bytes have been received to determine
                        validity; remain in the receive state, and retrieve
                        more bytes from client. */
                    handshaker->recv_pos += handshaker->recv_len;

                    /*  Validate the previous recv operation. */
                    nn_assert (handshaker->recv_pos <
                        sizeof (handshaker->response));

                    /*  Ensure we can back-track at least the length of the
                        termination sequence to determine how many bytes to
                        receive on the next retry. This is an assertion, not
                        a conditional, since under no condition is it
                        necessary to initially receive so few bytes. */
                    nn_assert (handshaker->recv_pos >=
                        (int) NN_WS_HANDSHAKE_TERMSEQ_LEN);

                    /*  If i goes to 0, it no need to compare. */
                    for (i = NN_WS_HANDSHAKE_TERMSEQ_LEN; i > 0; i--) {
                        if (memcmp (NN_WS_HANDSHAKE_TERMSEQ,
                            handshaker->response + handshaker->recv_pos - i,
                            i) == 0) {
                            break;
                        }
                    }

                    nn_assert (i < NN_WS_HANDSHAKE_TERMSEQ_LEN);

                    handshaker->recv_len = NN_WS_HANDSHAKE_TERMSEQ_LEN - i;

                    /*  In the unlikely case the client would overflow what we
                        assumed was a sufficiently-large buffer to receive the
                        handshake, we fail the connection. */
                    if (handshaker->recv_len + handshaker->recv_pos >
                        sizeof (handshaker->response)) {
                        nn_timer_stop (&handshaker->timer);
                        handshaker->state =
                            NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                    }
                    else {
                        handshaker->retries++;
                        nn_usock_recv (handshaker->usock,
                            handshaker->response + handshaker->recv_pos,
                            handshaker->recv_len, NULL);
                    }
                    return;
                default:
                    nn_fsm_error ("Unexpected handshake result",
                        handshaker->state, src, type);
                }
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  HANDSHAKE_SENT state.                                                     */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_HANDSHAKE_SENT:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:
                /*  As per RFC 6455 4.2.2, the handshake is now complete
                    and the connection is immediately ready for send/recv. */
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_DONE;
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_TIMER_ERROR state.                                               */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            /*  Ignore. The only circumstance the client would send bytes is
                to notify the server it is closing the connection. Wait for the
                socket to eventually error. */
            return;

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                nn_ws_handshake_leave (handshaker, NN_WS_HANDSHAKE_ERROR);
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_TIMER_DONE state.                                                */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_DONE:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            /*  Ignore. The only circumstance the client would send bytes is
                to notify the server it is closing the connection. Wait for the
                socket to eventually error. */
            return;

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                nn_ws_handshake_leave (handshaker, NN_WS_HANDSHAKE_OK);
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  DONE state.                                                               */
/*  The header exchange was either done successfully of failed. There's       */
/*  nothing that can be done in this state except stopping the object.        */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_DONE:
        nn_fsm_bad_source (handshaker->state, src, type);

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (handshaker->state, src, type);
    }
}